

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> * __thiscall
ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>::operator<<
          (ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
           *this,prevector<16U,_unsigned_char,_unsigned_int,_int> *obj)

{
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *os;
  
  os = *(ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> **)
        (in_FS_OFFSET + 0x28);
  Serialize<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>,16u,unsigned_char>
            (os,in_RDI);
  if (*(ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> **)
       (in_FS_OFFSET + 0x28) == os) {
    return (ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *)
           in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

ParamsStream& operator>>(U&& obj) { ::Unserialize(*this, obj); return *this; }